

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

int __thiscall MeCab::DecoderFeatureIndex::id(DecoderFeatureIndex *this,char *key)

{
  ulong *puVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  size_t size;
  uint64_t uVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  die local_11;
  
  size = strlen(key);
  uVar5 = fingerprint(key,size);
  puVar1 = this->key_;
  uVar2 = (this->super_FeatureIndex).maxid_;
  puVar3 = puVar1;
  uVar4 = uVar2;
  while (0 < (long)uVar4) {
    uVar8 = uVar4 >> 1;
    uVar9 = ~uVar8 + uVar4;
    uVar4 = uVar8;
    if (puVar3[uVar8] < uVar5) {
      puVar3 = puVar3 + uVar8 + 1;
      uVar4 = uVar9;
    }
  }
  iVar7 = -1;
  if (((puVar3 != puVar1 + uVar2) && (*puVar3 == uVar5)) &&
     (iVar7 = (int)((ulong)((long)puVar3 - (long)puVar1) >> 3), puVar1[iVar7] != uVar5)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1be);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"key_[n] == fp",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    die::~die(&local_11);
  }
  return iVar7;
}

Assistant:

int DecoderFeatureIndex::id(const char *key) {
  const uint64_t fp = fingerprint(key, std::strlen(key));
  const uint64_t *result = std::lower_bound(key_,
                                            key_ + maxid_,
                                            fp);
  if (result == key_ + maxid_ || *result != fp) {
    return -1;
  }
  const int n = static_cast<int>(result - key_);
  CHECK_DIE(key_[n] == fp);
  return n;
}